

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_bases.cc
# Opt level: O2

void google::protobuf::internal::ZeroFieldsBase::MergeImpl
               (MessageLite *to_param,MessageLite *from_param)

{
  Nullable<const_char_*> failure_msg;
  ZeroFieldsBase *from;
  ZeroFieldsBase *to;
  LogMessageFatal local_18;
  
  from = (ZeroFieldsBase *)from_param;
  to = (ZeroFieldsBase *)to_param;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<google::protobuf::internal::ZeroFieldsBase_const*,google::protobuf::internal::ZeroFieldsBase*>
                          (&from,&to,"from != to");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(to->super_Message).super_MessageLite._internal_metadata_,
               &(from->super_Message).super_MessageLite._internal_metadata_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_bases.cc"
             ,0x45,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_18);
}

Assistant:

void ZeroFieldsBase::MergeImpl(MessageLite& to_param,
                               const MessageLite& from_param) {
  auto* to = static_cast<ZeroFieldsBase*>(&to_param);
  const auto* from = static_cast<const ZeroFieldsBase*>(&from_param);
  ABSL_DCHECK_NE(from, to);
  to->_internal_metadata_.MergeFrom<UnknownFieldSet>(from->_internal_metadata_);
}